

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavesplit.cpp
# Opt level: O0

CommandOptions * wav_file_info(CommandOptions *Options)

{
  char *__s;
  Rational RVar1;
  FILE *__stream;
  int iVar2;
  ui32_t uVar3;
  long in_RSI;
  AudioDescriptor local_108 [2];
  allocator<char> local_89;
  string local_88 [39];
  undefined1 local_61;
  Rational local_60;
  WAVParser Parser;
  Rational PictureRate;
  AudioDescriptor ADesc;
  CommandOptions *Options_local;
  Result_t *result;
  
  ASDCP::PCM::AudioDescriptor::AudioDescriptor((AudioDescriptor *)&PictureRate);
  RVar1 = ASDCP::EditRate_24;
  ASDCP::PCM::WAVParser::WAVParser((WAVParser *)&local_60);
  local_61 = 0;
  __s = *(char **)(in_RSI + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,__s,&local_89);
  ASDCP::PCM::WAVParser::OpenRead((string *)Options,&local_60);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if (-1 < iVar2) {
    ASDCP::PCM::WAVParser::FillAudioDescriptor(local_108);
    Kumu::Result_t::~Result_t((Result_t *)local_108);
    __stream = _stderr;
    PictureRate = RVar1;
    uVar3 = ASDCP::PCM::CalcSamplesPerFrame((AudioDescriptor *)&PictureRate);
    fprintf(__stream,"48Khz PCM Audio, %s fps (%u spf)\n","24",(ulong)uVar3);
    fputs("AudioDescriptor:\n",_stderr);
    ASDCP::PCM::AudioDescriptorDump((AudioDescriptor *)&PictureRate,(_IO_FILE *)0x0);
  }
  local_61 = 1;
  ASDCP::PCM::WAVParser::~WAVParser((WAVParser *)&local_60);
  return Options;
}

Assistant:

Result_t
wav_file_info(CommandOptions& Options)
{
  PCM::AudioDescriptor ADesc;
  Rational         PictureRate = EditRate_24;
  PCM::WAVParser Parser;

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filename, PictureRate);

  if ( ASDCP_SUCCESS(result) )
    {
      Parser.FillAudioDescriptor(ADesc);
      ADesc.EditRate = PictureRate;
      fprintf(stderr, "48Khz PCM Audio, %s fps (%u spf)\n", "24",
	      PCM::CalcSamplesPerFrame(ADesc));
      fputs("AudioDescriptor:\n", stderr);
      PCM::AudioDescriptorDump(ADesc);
    }

  return result;
}